

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O2

int deqp::egl::SurfaceConfig::getColorBufferTypeRank(EGLenum type)

{
  int iVar1;
  TestError *this;
  allocator<char> local_89;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  code *local_28;
  EGLenum local_20;
  
  if (type == 0x308e) {
    iVar1 = 0;
  }
  else if (type == 0x3300) {
    iVar1 = 2;
  }
  else {
    if (type != 0x308f) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"Unknown color buffer type: ",&local_89);
      local_28 = eglu::getColorBufferTypeName;
      local_20 = type;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_88,&local_28);
      std::operator+(&local_48,&local_68,&local_88);
      tcu::TestError::TestError
                (this,local_48._M_dataplus._M_p,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglChooseConfigReference.cpp"
                 ,0x70);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int getColorBufferTypeRank (EGLenum type)
	{
		switch (type)
		{
			case EGL_RGB_BUFFER:			return 0;
			case EGL_LUMINANCE_BUFFER:		return 1;
			case EGL_YUV_BUFFER_EXT:		return 2;
			default:
				TCU_THROW(TestError, (std::string("Unknown color buffer type: ") + eglu::getColorBufferTypeStr(type).toString()).c_str());
		}
	}